

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.cpp
# Opt level: O0

void __thiscall mjs::anon_unknown_46::stringify_state::~stringify_state(stringify_state *this)

{
  bool bVar1;
  uint32_t uVar2;
  gc_vector<mjs::gc_heap_ptr_untracked<mjs::object,_true>_> *this_00;
  bool bVar3;
  stringify_state *this_local;
  
  bVar1 = gc_heap_ptr_untyped::operator_cast_to_bool(&(this->stack_).super_gc_heap_ptr_untyped);
  bVar3 = true;
  if (bVar1) {
    this_00 = gc_heap_ptr<mjs::gc_vector<mjs::gc_heap_ptr_untracked<mjs::object,_true>_>_>::
              operator->(&this->stack_);
    uVar2 = gc_vector<mjs::gc_heap_ptr_untracked<mjs::object,_true>_>::length(this_00);
    bVar3 = uVar2 == 0;
  }
  if (bVar3) {
    std::__cxx11::wstring::~wstring((wstring *)&this->gap_);
    std::__cxx11::wstring::~wstring((wstring *)&this->indent_);
    gc_heap_ptr<mjs::gc_vector<mjs::gc_heap_ptr_untracked<mjs::gc_string,_true>_>_>::~gc_heap_ptr
              (&this->property_names_);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr(&this->replacer_);
    gc_heap_ptr<mjs::gc_vector<mjs::gc_heap_ptr_untracked<mjs::object,_true>_>_>::~gc_heap_ptr
              (&this->stack_);
    gc_heap_ptr<mjs::global_object>::~gc_heap_ptr(&this->global_);
    return;
  }
  __assert_fail("!stack_ || stack_->length() == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/json_object.cpp"
                ,0x202,"mjs::(anonymous namespace)::stringify_state::~stringify_state()");
}

Assistant:

~stringify_state() {
        assert(!stack_ || stack_->length() == 0);
    }